

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O1

void fio_on_fork(void)

{
  uint8_t uVar1;
  uint uVar2;
  long lVar3;
  fio_data_s *pfVar4;
  fio_lock_i *pfVar5;
  long lVar6;
  size_t sVar7;
  long lVar8;
  long in_FS_OFFSET;
  
  fio_timer_lock = '\0';
  fio_data->lock = '\0';
  task_queue_normal.lock = '\0';
  task_queue_urgent.lock = '\0';
  *(undefined8 *)(in_FS_OFFSET + -0x2b0) = 0;
  if (arenas != (arena_s *)0x0) {
    memory.lock = '\0';
    memory.forked = '\x01';
    if (memory.cores != 0) {
      pfVar5 = &arenas->lock;
      sVar7 = memory.cores;
      do {
        *pfVar5 = '\0';
        pfVar5 = pfVar5 + 0x10;
        sVar7 = sVar7 - 1;
      } while (sVar7 != 0);
    }
  }
  fio_poll_init();
  lVar6 = 0;
  do {
    (&callback_collection[0].lock)[lVar6] = '\0';
    lVar6 = lVar6 + 0x18;
  } while (lVar6 != 0x150);
  uVar2 = fio_data->capa;
  if ((ulong)uVar2 != 0) {
    lVar8 = 0x6e;
    lVar6 = 0;
    do {
      pfVar4 = fio_data;
      *(undefined1 *)((long)&(fio_data->last_cycle).tv_sec + lVar8) = 0;
      *(undefined1 *)((long)pfVar4 + lVar8 + -2) = 0;
      lVar3 = *(long *)((long)pfVar4 + lVar8 + -0x16);
      if (lVar3 != 0) {
        *(undefined8 *)(lVar3 + 0x28) = 0;
        fio_force_close((ulong)*(byte *)((long)pfVar4 + lVar8 + -1) + lVar6);
      }
      lVar6 = lVar6 + 0x100;
      lVar8 = lVar8 + 0xa8;
    } while ((ulong)uVar2 << 8 != lVar6);
  }
  fio_pubsub_on_fork();
  fio_max_fd_shrink();
  uVar1 = fio_data->active;
  fio_data->active = '\0';
  fio_defer_perform();
  pfVar4 = fio_data;
  fio_data->active = uVar1;
  pfVar4->is_worker = '\x01';
  return;
}

Assistant:

static void fio_on_fork(void) {
  fio_timer_lock = FIO_LOCK_INIT;
  fio_data->lock = FIO_LOCK_INIT;
  fio_defer_on_fork();
  fio_malloc_after_fork();
  fio_poll_init();
  fio_state_callback_on_fork();

  const size_t limit = fio_data->capa;
  for (size_t i = 0; i < limit; ++i) {
    fd_data(i).sock_lock = FIO_LOCK_INIT;
    fd_data(i).protocol_lock = FIO_LOCK_INIT;
    if (fd_data(i).protocol) {
      fd_data(i).protocol->rsv = 0;
      fio_force_close(fd2uuid(i));
    }
  }

  fio_pubsub_on_fork();
  fio_max_fd_shrink();
  uint16_t old_active = fio_data->active;
  fio_data->active = 0;
  fio_defer_perform();
  fio_data->active = old_active;
  fio_data->is_worker = 1;
}